

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

ActionResultHolder<bool> *
testing::internal::ActionResultHolder<bool>::
PerformDefaultAction<bool(n_e_s::core::INesController::Button)>
          (FunctionMocker<bool_(n_e_s::core::INesController::Button)> *func_mocker,
          ArgumentTuple *args,string *call_description)

{
  Result_conflict1 value;
  ActionResultHolder<bool> *this;
  Wrapper local_21;
  string *local_20;
  string *call_description_local;
  ArgumentTuple *args_local;
  FunctionMocker<bool_(n_e_s::core::INesController::Button)> *func_mocker_local;
  
  local_20 = call_description;
  call_description_local = (string *)args;
  args_local = (ArgumentTuple *)func_mocker;
  this = (ActionResultHolder<bool> *)operator_new(0x10);
  value = FunctionMocker<bool_(n_e_s::core::INesController::Button)>::PerformDefaultAction
                    ((FunctionMocker<bool_(n_e_s::core::INesController::Button)> *)args_local,
                     (ArgumentTuple *)call_description_local,local_20);
  ReferenceOrValueWrapper<bool>::ReferenceOrValueWrapper(&local_21,value);
  ActionResultHolder(this,local_21);
  return this;
}

Assistant:

static ActionResultHolder* PerformDefaultAction(
      const FunctionMocker<F>* func_mocker,
      typename Function<F>::ArgumentTuple&& args,
      const std::string& call_description) {
    return new ActionResultHolder(Wrapper(func_mocker->PerformDefaultAction(
        std::move(args), call_description)));
  }